

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

HttpResponse * __thiscall HttpResponse::GetHttpVersion_abi_cxx11_(HttpResponse *this)

{
  long in_RSI;
  HttpResponse *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
  return this;
}

Assistant:

string HttpResponse::GetHttpVersion() {
  return _httpVersion;
}